

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_program.c
# Opt level: O0

ssize_t program_filter_read(archive_read_filter *self,void **buff)

{
  long lVar1;
  ssize_t sVar2;
  undefined8 *in_RSI;
  char *in_RDI;
  bool bVar3;
  char *p;
  size_t total;
  ssize_t bytes;
  program_filter *state;
  ulong local_30;
  archive_read_filter *in_stack_fffffffffffffff8;
  
  lVar1 = *(long *)(in_RDI + 0x50);
  local_30 = 0;
  while( true ) {
    bVar3 = false;
    if (*(int *)(lVar1 + 0x28) != -1) {
      bVar3 = local_30 < *(ulong *)(lVar1 + 0x38);
    }
    if (!bVar3) break;
    sVar2 = child_read(in_stack_fffffffffffffff8,in_RDI,(size_t)in_RSI);
    if (sVar2 < 0) {
      return -0x1e;
    }
    if (sVar2 == 0) break;
    local_30 = sVar2 + local_30;
  }
  *in_RSI = *(undefined8 *)(lVar1 + 0x30);
  return local_30;
}

Assistant:

static ssize_t
program_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct program_filter *state;
	ssize_t bytes;
	size_t total;
	char *p;

	state = (struct program_filter *)self->data;

	total = 0;
	p = state->out_buf;
	while (state->child_stdout != -1 && total < state->out_buf_len) {
		bytes = child_read(self, p, state->out_buf_len - total);
		if (bytes < 0)
			/* No recovery is possible if we can no longer
			 * read from the child. */
			return (ARCHIVE_FATAL);
		if (bytes == 0)
			/* We got EOF from the child. */
			break;
		total += bytes;
		p += bytes;
	}

	*buff = state->out_buf;
	return (total);
}